

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

void DivisionHelper<unsigned_int,_int,_1>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(uint *t,int *u,uint *result)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *u;
  if (uVar1 == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  uVar2 = *t;
  uVar3 = 0;
  if (uVar2 != 0) {
    if ((int)uVar1 < 1) {
      if (-1 < (int)uVar1) {
        __assert_fail("t < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                      ,0x2ce,"static std::uint32_t AbsValueHelper<int, 0>::Abs(T) [T = int]");
      }
      if (-uVar1 <= uVar2) {
        safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
      }
    }
    else {
      uVar3 = uVar2 / uVar1;
    }
  }
  *result = uVar3;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {

        if( u == 0 )
            E::SafeIntOnDivZero();

        if( t == 0 )
        {
            result = 0;
            return;
        }

        if( u > 0 )
        {
            result = (T)( t/u );
            return;
        }

        // it is always an error to try and divide an unsigned number by a negative signed number
        // unless u is bigger than t
        if( AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ) > t )
        {
            result = 0;
            return;
        }

        E::SafeIntOnOverflow();
    }